

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSop.c
# Opt level: O3

char * Abc_SopCreateFromTruthIsop(Mem_Flex_t *pMan,int nVars,word *pTruth,Vec_Int_t *vCover)

{
  uint uVar1;
  ulong uVar2;
  char *pcVar3;
  
  uVar1 = 1 << ((char)nVars - 6U & 0x1f);
  if (nVars < 7) {
    uVar1 = 1;
  }
  if (0xf < nVars) {
    __assert_fail("nVars < 16",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcSop.c"
                  ,0x1cd,"char *Abc_SopCreateFromTruthIsop(Mem_Flex_t *, int, word *, Vec_Int_t *)")
    ;
  }
  if ((int)uVar1 < 1) {
LAB_008733fb:
    uVar1 = Kit_TruthIsop((uint *)pTruth,nVars,vCover,1);
    if (nVars < 1) {
      __assert_fail("nVars > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcSop.c"
                    ,0x1dd,
                    "char *Abc_SopCreateFromTruthIsop(Mem_Flex_t *, int, word *, Vec_Int_t *)");
    }
    if (1 < uVar1) {
      __assert_fail("RetValue == 0 || RetValue == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcSop.c"
                    ,0x1de,
                    "char *Abc_SopCreateFromTruthIsop(Mem_Flex_t *, int, word *, Vec_Int_t *)");
    }
    pcVar3 = Abc_SopCreateFromIsop(pMan,nVars,vCover);
    if (uVar1 != 0) {
      Abc_SopComplement(pcVar3);
    }
    return pcVar3;
  }
  uVar2 = 0;
  do {
    if (pTruth[uVar2] != 0) {
      if (uVar1 != (uint)uVar2) {
        if ((int)uVar1 < 1) goto LAB_008733fb;
        uVar2 = 0;
        goto LAB_008733dd;
      }
      break;
    }
    uVar2 = uVar2 + 1;
  } while (uVar1 != uVar2);
  pcVar3 = " 0\n";
  goto LAB_008733c5;
  while (uVar2 = uVar2 + 1, uVar1 != uVar2) {
LAB_008733dd:
    if (pTruth[uVar2] != 0xffffffffffffffff) {
      if (uVar1 != (uint)uVar2) goto LAB_008733fb;
      break;
    }
  }
  pcVar3 = " 1\n";
LAB_008733c5:
  pcVar3 = Abc_SopRegister(pMan,pcVar3);
  return pcVar3;
}

Assistant:

char * Abc_SopCreateFromTruthIsop( Mem_Flex_t * pMan, int nVars, word * pTruth, Vec_Int_t * vCover )
{
    char * pSop = NULL;
    int w, nWords  = Abc_Truth6WordNum( nVars );
    assert( nVars < 16 );

    for ( w = 0; w < nWords; w++ )
        if ( pTruth[w] )
            break;
    if ( w == nWords )
        return Abc_SopRegister( pMan, " 0\n" );

    for ( w = 0; w < nWords; w++ )
        if ( ~pTruth[w] )
            break;
    if ( w == nWords )
        return Abc_SopRegister( pMan, " 1\n" );

    {
        int RetValue = Kit_TruthIsop( (unsigned *)pTruth, nVars, vCover, 1 );
        assert( nVars > 0 );
        assert( RetValue == 0 || RetValue == 1 );
        pSop = Abc_SopCreateFromIsop( pMan, nVars, vCover );
        if ( RetValue )
            Abc_SopComplement( pSop );
    }
    return pSop;
}